

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O2

EGLImageKHR __thiscall
deqp::egl::Image::GLImageSource::createImage
          (GLImageSource *this,Library *egl,EGLDisplay dpy,EGLContext ctx,
          EGLClientBuffer clientBuffer)

{
  uint uVar1;
  int iVar2;
  deUint32 err;
  mapped_type_conflict *pmVar3;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> attribs;
  AttribMap attribMap;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  (*(this->super_ImageSource)._vptr_ImageSource[6])(&local_60,this);
  local_78._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x30d2;
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_60,(key_type_conflict *)&local_78);
  *pmVar3 = 1;
  eglu::attribMapToList((vector<int,_std::allocator<int>_> *)&local_78,(AttribMap *)&local_60);
  uVar1 = (*(this->super_ImageSource)._vptr_ImageSource[7])(this);
  iVar2 = (*egl->_vptr_Library[8])
                    (egl,dpy,ctx,(ulong)uVar1,clientBuffer,
                     CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_78._M_impl.super__Vector_impl_data._M_start._0_4_));
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"eglCreateImageKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                   ,0xad);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return (EGLImageKHR)CONCAT44(extraout_var,iVar2);
}

Assistant:

EGLImageKHR GLImageSource::createImage (const Library& egl, EGLDisplay dpy, EGLContext ctx, EGLClientBuffer clientBuffer) const
{
	AttribMap				attribMap	= getCreateAttribs();

	attribMap[EGL_IMAGE_PRESERVED_KHR] = EGL_TRUE;

	{
		const vector<EGLint>	attribs	= eglu::attribMapToList(attribMap);
		const EGLImageKHR		image	= egl.createImageKHR(dpy, ctx, getSource(),
															 clientBuffer, &attribs.front());
		EGLU_CHECK_MSG(egl, "eglCreateImageKHR()");
		return image;
	}
}